

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O2

void nn_send_loop(nn_options_t *options,int sock)

{
  uint uVar1;
  uint64_t uVar2;
  int *piVar3;
  uint64_t uVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = (int)(options->send_interval * 1000.0);
  do {
    uVar2 = nn_clock_ms();
    uVar1 = nn_send(sock,(options->data_to_send).data,(long)(options->data_to_send).length,0);
    if ((int)uVar1 < 0) {
      piVar3 = __errno_location();
      if (*piVar3 != 0xb) goto LAB_001039d1;
      fwrite("Message not sent (EAGAIN)\n",0x1a,1,_stderr);
    }
    else {
LAB_001039d1:
      nn_assert_errno(~uVar1 >> 0x1f,"Can\'t send");
    }
    if (iVar5 < 0) {
      return;
    }
    uVar4 = nn_clock_ms();
    lVar6 = (uVar2 + (long)iVar5) - uVar4;
    if (0 < lVar6) {
      nn_sleep((int)lVar6);
    }
  } while( true );
}

Assistant:

void nn_send_loop (nn_options_t *options, int sock)
{
    int rc;
    uint64_t start_time;
    int64_t time_to_sleep, interval;

    interval = (int)(options->send_interval*1000);

    for (;;) {
        start_time = nn_clock_ms();
        rc = nn_send (sock,
            options->data_to_send.data, options->data_to_send.length,
            0);
        if (rc < 0 && errno == EAGAIN) {
            fprintf (stderr, "Message not sent (EAGAIN)\n");
        } else {
            nn_assert_errno (rc >= 0, "Can't send");
        }
        if (interval >= 0) {
            time_to_sleep = (start_time + interval) - nn_clock_ms();
            if (time_to_sleep > 0) {
                nn_sleep ((int) time_to_sleep);
            }
        } else {
            break;
        }
    }
}